

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O2

ImageT<unsigned_short,_4U> * __thiscall
ImageT<unsigned_short,4u>::copyTo<ImageT<unsigned_short,3u>>
          (ImageT<unsigned_short,4u> *this,ImageT<unsigned_short,_3U> *dst,string_view swizzle)

{
  long lVar1;
  ulong uVar2;
  unsigned_short uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  uint32_t c;
  ulong uVar8;
  long lVar9;
  long lVar10;
  
  iVar4 = (**(code **)(*(long *)this + 0x30))(this,dst,swizzle._M_len);
  iVar5 = (**(code **)(*(long *)dst + 0x30))(dst);
  if (iVar4 != iVar5) {
    __assert_fail("getComponentSize() == dst.getComponentSize()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x50a,
                  "ImageT<componentType, componentCount> &ImageT<unsigned short, 4>::copyTo(DstImage &, std::string_view) [componentType = unsigned short, componentCount = 4, DstImage = ImageT<unsigned short, 3>]"
                 );
  }
  iVar4 = *(int *)(this + 8);
  if ((iVar4 != *(int *)(dst + 8)) || (iVar5 = *(int *)(this + 0xc), iVar5 != *(int *)(dst + 0xc)))
  {
    __assert_fail("width == dst.getWidth() && height == dst.getHeight()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x50b,
                  "ImageT<componentType, componentCount> &ImageT<unsigned short, 4>::copyTo(DstImage &, std::string_view) [componentType = unsigned short, componentCount = 4, DstImage = ImageT<unsigned short, 3>]"
                 );
  }
  *(undefined8 *)(dst + 0x10) = *(undefined8 *)(this + 0x10);
  lVar10 = 0;
  uVar7 = 0;
  do {
    if ((uint)(iVar5 * iVar4) <= uVar7) {
      return (ImageT<unsigned_short,_4U> *)this;
    }
    uVar8 = 0;
    lVar9 = lVar10;
    while( true ) {
      uVar6 = (**(code **)(*(long *)dst + 0x28))(dst);
      if (uVar6 <= uVar8) break;
      uVar6 = (**(code **)(*(long *)this + 0x28))(this);
      if (uVar6 <= uVar8) break;
      lVar1 = *(long *)(dst + 0x18);
      uVar3 = ImageT<unsigned_short,_4U>::swizzlePixel
                        ((ImageT<unsigned_short,_4U> *)this,
                         (Color *)(*(long *)(this + 0x18) + uVar7 * 8),swizzle._M_str[uVar8]);
      uVar2 = 2;
      if ((uint)uVar8 < 2) {
        uVar2 = uVar8;
      }
      *(unsigned_short *)(lVar1 + uVar7 * 6 + (uVar2 & 0xffffffff) * 2) = uVar3;
      uVar8 = uVar8 + 1;
      lVar9 = lVar9 + 2;
    }
    while( true ) {
      uVar6 = (**(code **)(*(long *)dst + 0x28))(dst);
      if (uVar6 <= uVar8) break;
      if (uVar8 < 3) {
        *(undefined2 *)(*(long *)(dst + 0x18) + lVar9) = 0;
      }
      else {
        *(undefined2 *)(*(long *)(dst + 0x18) + 4 + uVar7 * 6) = 0xffff;
      }
      uVar8 = uVar8 + 1;
      lVar9 = lVar9 + 2;
    }
    uVar7 = uVar7 + 1;
    iVar4 = *(int *)(this + 8);
    iVar5 = *(int *)(this + 0xc);
    lVar10 = lVar10 + 6;
  } while( true );
}

Assistant:

ImageT& copyTo(DstImage& dst, std::string_view swizzle) {
        assert(getComponentSize() == dst.getComponentSize());
        assert(width == dst.getWidth() && height == dst.getHeight());

        dst.setTransferFunction(transferFunction);
        dst.setPrimaries(primaries);
        for (size_t i = 0; i < getPixelCount(); i++) {
            uint32_t c;
            for (c = 0; c < dst.getComponentCount(); c++) {
                if (c < getComponentCount())
                    dst.pixels[i].set(c, swizzlePixel(pixels[i], swizzle[c]));
                else
                    break;
            }
            for (; c < dst.getComponentCount(); c++)
                if (c < 3)
                    dst.pixels[i].set(c, componentType{0});
                else
                    dst.pixels[i].set(c, Color::one());
        }
        return *this;
    }